

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusplatforminputcontext.cpp
# Opt level: O0

QString * QIBusPlatformInputContextPrivate::getSocketPath(void)

{
  bool bVar1;
  qsizetype qVar2;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
  *in_RDI;
  long in_FS_OFFSET;
  int pos2;
  int pos;
  bool isWayland;
  QString *path;
  QByteArray host;
  QByteArray displayNumber;
  QByteArray display;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
  *this;
  int in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  int iVar3;
  undefined2 in_stack_fffffffffffffc94;
  byte bVar4;
  byte bVar5;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
  *this_00;
  qsizetype in_stack_fffffffffffffca8;
  char *in_stack_fffffffffffffcc8;
  undefined1 local_2e8 [152];
  QDebug local_250;
  undefined1 local_248 [24];
  undefined1 local_230 [48];
  QByteArray local_200;
  char local_1e8 [24];
  char local_1d0 [24];
  QByteArray local_1b8;
  QByteArray local_1a0 [16];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1a0[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_1a0[0].d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_1a0[0].d.size = -0x5555555555555556;
  this = in_RDI;
  this_00 = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x11c767);
  local_1b8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_1b8.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_1b8.d.size = -0x5555555555555556;
  QByteArray::QByteArray(&local_1b8,"0",-1);
  bVar5 = 0;
  bVar4 = 0;
  (this->a).a.a.a.a.a.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  *(char16_t **)((long)&(this->a).a.a.a.a.a.d + 8) = (char16_t *)0xaaaaaaaaaaaaaaaa;
  *(qsizetype *)((long)&(this->a).a.a.a.a.a.d + 0x10) = -0x5555555555555556;
  qEnvironmentVariable((char *)this);
  bVar1 = QString::isNull((QString *)0x11c7f4);
  if (bVar1) {
    qgetenv(local_1d0);
    QByteArray::operator=((QByteArray *)this,(QByteArray *)in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x11c840);
    bVar1 = QByteArray::isEmpty((QByteArray *)0x11c84d);
    if (bVar1) {
      qgetenv(local_1e8);
      QByteArray::operator=((QByteArray *)this,(QByteArray *)in_RDI);
      QByteArray::~QByteArray((QByteArray *)0x11c88e);
    }
    else {
      bVar5 = 1;
    }
    iVar3 = 0;
  }
  else {
    bVar4 = 1;
    iVar3 = 1;
  }
  if ((bVar4 & 1) == 0) {
    QString::~QString((QString *)0x11c8a9);
  }
  if (iVar3 == 0) {
    local_200.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_200.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_200.d.size = -0x5555555555555556;
    QByteArray::QByteArray(&local_200,"unix",-1);
    if ((bVar5 & 1) == 0) {
      qVar2 = QByteArray::indexOf((QByteArray *)
                                  CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                                  (char)((ulong)this >> 0x38),(qsizetype)in_RDI);
      in_stack_fffffffffffffc8c = (int)qVar2;
      if (0 < in_stack_fffffffffffffc8c) {
        QByteArray::left((QByteArray *)
                         CONCAT17(bVar5,CONCAT16(bVar4,CONCAT24(in_stack_fffffffffffffc94,iVar3))),
                         in_stack_fffffffffffffca8);
        QByteArray::operator=((QByteArray *)this,(QByteArray *)in_RDI);
        QByteArray::~QByteArray((QByteArray *)0x11c97d);
      }
      in_stack_fffffffffffffc8c = in_stack_fffffffffffffc8c + 1;
      qVar2 = QByteArray::indexOf((QByteArray *)
                                  CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                                  (char)((ulong)this >> 0x38),(qsizetype)in_RDI);
      in_stack_fffffffffffffc88 = (int)qVar2;
      if (in_stack_fffffffffffffc88 < 1) {
        QByteArray::mid((longlong)local_248,(longlong)local_1a0);
        QByteArray::operator=((QByteArray *)this,(QByteArray *)in_RDI);
        QByteArray::~QByteArray((QByteArray *)0x11ca36);
      }
      else {
        QByteArray::mid((longlong)local_230,(longlong)local_1a0);
        QByteArray::operator=((QByteArray *)this,(QByteArray *)in_RDI);
        QByteArray::~QByteArray((QByteArray *)0x11c9f1);
      }
    }
    else {
      QByteArray::operator=(&local_1b8,local_1a0);
    }
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcQpaInputMethods();
    anon_unknown.dwarf_801cf::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this,(QLoggingCategory *)in_RDI);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_801cf::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11ca8e);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)
                 CONCAT17(bVar5,CONCAT16(bVar4,CONCAT24(in_stack_fffffffffffffc94,iVar3))),
                 (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                 (int)((ulong)this >> 0x20),(char *)in_RDI,(char *)0x11caa7);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)this_00,in_stack_fffffffffffffcc8);
      QDebug::operator<<((QDebug *)
                         CONCAT17(bVar5,CONCAT16(bVar4,CONCAT24(in_stack_fffffffffffffc94,iVar3))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
                        );
      QDebug::operator<<((QDebug *)this_00,in_stack_fffffffffffffcc8);
      QDebug::operator<<((QDebug *)
                         CONCAT17(bVar5,CONCAT16(bVar4,CONCAT24(in_stack_fffffffffffffc94,iVar3))),
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
                        );
      QDebug::~QDebug(&local_250);
      local_10 = local_10 & 0xffffffffffffff00;
    }
    QStandardPaths::writableLocation((StandardLocation)local_2e8);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),(size_t)this);
    operator+((QString *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
              (QLatin1String *)this);
    QDBusConnection::localMachineId();
    QLatin1String::QLatin1String
              ((QLatin1String *)
               CONCAT17(bVar5,CONCAT16(bVar4,CONCAT24(in_stack_fffffffffffffc94,iVar3))),
               (QByteArray *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    operator+((QStringBuilder<QString,_QLatin1String> *)
              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),(QLatin1String *)this);
    operator+((QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> *)
              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),(char16_t *)this);
    QString::fromLocal8Bit<void>((QByteArray *)this);
    operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>
               *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),(QString *)this);
    operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
               *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),(char16_t *)this);
    QString::fromLocal8Bit<void>((QByteArray *)this);
    operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>
               *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),(QString *)this);
    QStringBuilder::operator_cast_to_QString(in_RDI);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
    ::~QStringBuilder(this);
    QString::~QString((QString *)0x11cc65);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>
    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>
                       *)0x11cc72);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
                       *)this);
    QString::~QString((QString *)0x11cc89);
    QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>
    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>
                       *)0x11cc96);
    QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> *)0x11cca3);
    QByteArray::~QByteArray((QByteArray *)0x11ccad);
    QStringBuilder<QString,_QLatin1String>::~QStringBuilder
              ((QStringBuilder<QString,_QLatin1String> *)0x11ccba);
    QString::~QString((QString *)0x11ccc7);
    QByteArray::~QByteArray((QByteArray *)0x11ccdc);
  }
  QByteArray::~QByteArray((QByteArray *)0x11cce9);
  QByteArray::~QByteArray((QByteArray *)0x11ccf6);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString QIBusPlatformInputContextPrivate::getSocketPath()
{
    QByteArray display;
    QByteArray displayNumber = "0";
    bool isWayland = false;

    if (QString path = qEnvironmentVariable("IBUS_ADDRESS_FILE"); !path.isNull()) {
        return path;
    } else if (display = qgetenv("WAYLAND_DISPLAY"); !display.isEmpty()) {
        isWayland = true;
    } else {
        display = qgetenv("DISPLAY");
    }
    QByteArray host = "unix";

    if (isWayland) {
        displayNumber = display;
    } else {
        int pos = display.indexOf(':');
        if (pos > 0)
            host = display.left(pos);
        ++pos;
        int pos2 = display.indexOf('.', pos);
        if (pos2 > 0)
            displayNumber = display.mid(pos, pos2 - pos);
         else
            displayNumber = display.mid(pos);
    }

    qCDebug(lcQpaInputMethods) << "host=" << host << "displayNumber" << displayNumber;

    return QStandardPaths::writableLocation(QStandardPaths::ConfigLocation) +
               "/ibus/bus/"_L1 +
               QLatin1StringView(QDBusConnection::localMachineId()) +
               u'-' + QString::fromLocal8Bit(host) + u'-' + QString::fromLocal8Bit(displayNumber);
}